

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_Hash.c
# Opt level: O2

EverCrypt_Hash_Incremental_state_t *
EverCrypt_Hash_Incremental_malloc(Spec_Hash_Definitions_hash_alg a)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint8_t *puVar3;
  Lib_IntVector_Intrinsics_vec256 *palVar4;
  EverCrypt_Hash_state_s *ctx;
  EverCrypt_Hash_Incremental_state_t *pEVar5;
  state_s_tags sVar6;
  undefined7 in_register_00000039;
  
  block_len(a);
  uVar2 = block_len(a);
  puVar3 = (uint8_t *)calloc((ulong)uVar2,1);
  switch(CONCAT71(in_register_00000039,a) & 0xffffffff) {
  case 0:
    palVar4 = (Lib_IntVector_Intrinsics_vec256 *)calloc(8,4);
    sVar6 = '\x02';
    break;
  case 1:
    palVar4 = (Lib_IntVector_Intrinsics_vec256 *)calloc(8,4);
    sVar6 = '\x03';
    break;
  case 2:
    palVar4 = (Lib_IntVector_Intrinsics_vec256 *)calloc(8,8);
    sVar6 = '\x04';
    break;
  case 3:
    palVar4 = (Lib_IntVector_Intrinsics_vec256 *)calloc(8,8);
    sVar6 = '\x05';
    break;
  case 4:
    palVar4 = (Lib_IntVector_Intrinsics_vec256 *)calloc(5,4);
    sVar6 = '\x01';
    break;
  case 5:
    palVar4 = (Lib_IntVector_Intrinsics_vec256 *)calloc(4,4);
    sVar6 = '\0';
    break;
  case 6:
    _Var1 = EverCrypt_AutoConfig2_has_vec128();
    if (_Var1) {
      sVar6 = '\v';
      palVar4 = (Lib_IntVector_Intrinsics_vec256 *)Hacl_Hash_Blake2s_Simd128_malloc_with_key();
    }
    else {
      palVar4 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x10,4);
      sVar6 = '\n';
    }
    break;
  case 7:
    _Var1 = EverCrypt_AutoConfig2_has_vec256();
    if (_Var1) {
      sVar6 = '\r';
      palVar4 = Hacl_Hash_Blake2b_Simd256_malloc_with_key();
    }
    else {
      palVar4 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x10,8);
      sVar6 = '\f';
    }
    break;
  case 8:
    palVar4 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x19,8);
    sVar6 = '\a';
    break;
  case 9:
    palVar4 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x19,8);
    sVar6 = '\x06';
    break;
  case 10:
    palVar4 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x19,8);
    sVar6 = '\b';
    break;
  case 0xb:
    palVar4 = (Lib_IntVector_Intrinsics_vec256 *)calloc(0x19,8);
    sVar6 = '\t';
    break;
  default:
    fprintf(_stderr,"KaRaMeL incomplete match at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/EverCrypt_Hash.c"
            ,0x107);
    exit(0xfd);
  }
  ctx = (EverCrypt_Hash_state_s *)malloc(0x10);
  ctx->tag = sVar6;
  (ctx->field_1).case_MD5_s = (uint32_t *)palVar4;
  pEVar5 = (EverCrypt_Hash_Incremental_state_t *)malloc(0x18);
  pEVar5->block_state = ctx;
  pEVar5->buf = puVar3;
  pEVar5->total_len = 0;
  init((EVP_PKEY_CTX *)ctx);
  return pEVar5;
}

Assistant:

EverCrypt_Hash_Incremental_state_t
*EverCrypt_Hash_Incremental_malloc(Spec_Hash_Definitions_hash_alg a)
{
  KRML_CHECK_SIZE(sizeof (uint8_t), block_len(a));
  uint8_t *buf = (uint8_t *)KRML_HOST_CALLOC(block_len(a), sizeof (uint8_t));
  EverCrypt_Hash_state_s *block_state = create_in(a);
  EverCrypt_Hash_Incremental_state_t
  s = { .block_state = block_state, .buf = buf, .total_len = (uint64_t)0U };
  EverCrypt_Hash_Incremental_state_t
  *p =
    (EverCrypt_Hash_Incremental_state_t *)KRML_HOST_MALLOC(sizeof (
        EverCrypt_Hash_Incremental_state_t
      ));
  p[0U] = s;
  init(block_state);
  return p;
}